

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

int ensure_in_buff_size(archive_read_filter *self,uudecode *uudecode,size_t size)

{
  uchar *__src;
  ulong uVar1;
  uchar *__dest;
  int iVar2;
  ulong __size;
  bool bVar3;
  
  __size = uudecode->in_allocated;
  iVar2 = 0;
  if (__size < size) {
    do {
      uVar1 = __size * 2;
      bVar3 = __size < 0x8000;
      __size = __size + 0x400;
      if (bVar3) {
        __size = uVar1;
      }
    } while (__size < size);
    __dest = (uchar *)malloc(__size);
    if (__dest == (uchar *)0x0) {
      archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for uudecode");
      iVar2 = -0x1e;
    }
    else {
      __src = uudecode->in_buff;
      if ((long)uudecode->in_cnt != 0) {
        memmove(__dest,__src,(long)uudecode->in_cnt);
      }
      free(__src);
      uudecode->in_buff = __dest;
      uudecode->in_allocated = __size;
    }
  }
  return iVar2;
}

Assistant:

static int
ensure_in_buff_size(struct archive_read_filter *self,
    struct uudecode *uudecode, size_t size)
{

	if (size > uudecode->in_allocated) {
		unsigned char *ptr;
		size_t newsize;

		/*
		 * Calculate a new buffer size for in_buff.
		 * Increase its value until it has enough size we need.
		 */
		newsize = uudecode->in_allocated;
		do {
			if (newsize < IN_BUFF_SIZE*32)
				newsize <<= 1;
			else
				newsize += IN_BUFF_SIZE;
		} while (size > newsize);
		/* Allocate the new buffer. */
		ptr = malloc(newsize);
		if (ptr == NULL) {
			free(ptr);
			archive_set_error(&self->archive->archive,
			    ENOMEM,
    			    "Can't allocate data for uudecode");
			return (ARCHIVE_FATAL);
		}
		/* Move the remaining data in in_buff into the new buffer. */
		if (uudecode->in_cnt)
			memmove(ptr, uudecode->in_buff, uudecode->in_cnt);
		/* Replace in_buff with the new buffer. */
		free(uudecode->in_buff);
		uudecode->in_buff = ptr;
		uudecode->in_allocated = newsize;
	}
	return (ARCHIVE_OK);
}